

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EmissionSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EmissionSystem *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pEVar3;
  KString local_260;
  KString local_240;
  __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
  local_220;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EmissionSystem *local_18;
  EmissionSystem *this_local;
  
  local_18 = this;
  this_local = (EmissionSystem *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Emission System:\n\t");
  poVar2 = std::operator<<(poVar2,"System Data Length (32 bits):    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SystemDataLength);
  poVar2 = std::operator<<(poVar2,"\n\t");
  poVar2 = std::operator<<(poVar2,"Number Of Emitter Beams:         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumberOfBeams);
  poVar2 = std::operator<<(poVar2,"\n");
  EmitterSystem::GetAsString_abi_cxx11_(&local_1f0,&this->m_EmitterSystemRecord);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Location:   ");
  Vector::GetAsString_abi_cxx11_((KString *)&citr,&this->m_Location);
  std::operator<<(poVar2,(string *)&citr);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  citrEnd = std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
            ::begin(&this->m_vEmitterBeams);
  local_220._M_current =
       (EmitterBeam *)
       std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::end
                 (&this->m_vEmitterBeams);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_220);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
             ::operator->(&citrEnd);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_260);
    UTILS::IndentString(&local_240,&local_260,1,'\t');
    std::operator<<(local_190,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EmissionSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Emission System:\n\t"
       << "System Data Length (32 bits):    " << ( KUINT16 )m_ui8SystemDataLength            << "\n\t"
       << "Number Of Emitter Beams:         " << ( KUINT16 )m_ui8NumberOfBeams               << "\n"
       << IndentString( m_EmitterSystemRecord.GetAsString(), 1 )                             << "\t"
       << "Location:   " << m_Location.GetAsString();

    vector<EmitterBeam>::const_iterator citr = m_vEmitterBeams.begin();
    vector<EmitterBeam>::const_iterator citrEnd = m_vEmitterBeams.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}